

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

Json __thiscall
json11::anon_unknown_21::JsonParser::expect(JsonParser *this,string *expected,Json *res)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  Json *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Json JVar7;
  string local_b8 [48];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [40];
  Json *res_local;
  string *expected_local;
  JsonParser *this_local;
  
  res_local = res;
  expected_local = expected;
  this_local = this;
  if (*(long *)(expected + 8) != 0) {
    *(long *)(expected + 8) = *(long *)(expected + 8) + -1;
    uVar1 = *(ulong *)expected;
    uVar2 = *(ulong *)(expected + 8);
    psVar4 = (string *)std::__cxx11::string::length();
    iVar3 = std::__cxx11::string::compare(uVar1,uVar2,psVar4);
    if (iVar3 == 0) {
      lVar5 = std::__cxx11::string::length();
      *(long *)(expected + 8) = lVar5 + *(long *)(expected + 8);
      Json::Json((Json *)this,in_RCX);
      _Var6._M_pi = extraout_RDX;
    }
    else {
      std::operator+((char *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "parse error: expected ");
      std::operator+(local_68,(char *)local_88);
      uVar1 = *(ulong *)expected;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_b8,uVar1);
      std::operator+(local_48,local_68);
      fail(this,expected);
      std::__cxx11::string::~string((string *)local_48);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string(local_88);
      _Var6._M_pi = extraout_RDX_00;
    }
    JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var6._M_pi;
    JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Json)JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("i != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/json11/json11/json11.cpp"
                ,0x276,
                "Json json11::(anonymous namespace)::JsonParser::expect(const string &, Json)");
}

Assistant:

Json expect(const string &expected, Json res) {
        assert(i != 0);
        i--;
        if (str.compare(i, expected.length(), expected) == 0) {
            i += expected.length();
            return res;
        } else {
            return fail("parse error: expected " + expected + ", got " + str.substr(i, expected.length()));
        }
    }